

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Audio.cpp
# Opt level: O2

void __thiscall Amiga::Audio::set_modulation_flags(Audio *this,uint16_t flags)

{
  byte bVar1;
  
  bVar1 = (byte)flags;
  this->channels_[3].attach_period = (bool)(bVar1 >> 7);
  this->channels_[2].attach_period = (bool)(bVar1 >> 6 & 1);
  this->channels_[1].attach_period = (bool)(bVar1 >> 5 & 1);
  this->channels_[0].attach_period = (bool)(bVar1 >> 4 & 1);
  this->channels_[3].attach_volume = (bool)(bVar1 >> 3 & 1);
  this->channels_[2].attach_volume = (bool)(bVar1 >> 2 & 1);
  this->channels_[1].attach_volume = (bool)(bVar1 >> 1 & 1);
  this->channels_[0].attach_volume = (bool)(bVar1 & 1);
  return;
}

Assistant:

void Audio::set_modulation_flags(uint16_t flags) {
	channels_[3].attach_period = flags & 0x80;
	channels_[2].attach_period = flags & 0x40;
	channels_[1].attach_period = flags & 0x20;
	channels_[0].attach_period = flags & 0x10;

	channels_[3].attach_volume = flags & 0x08;
	channels_[2].attach_volume = flags & 0x04;
	channels_[1].attach_volume = flags & 0x02;
	channels_[0].attach_volume = flags & 0x01;
}